

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datatypes.hpp
# Opt level: O2

void mxx::tuple_members<3UL,_2UL,_int,_int,_int>::get
               (map<long,_ompi_datatype_t_*,_std::less<long>,_std::allocator<std::pair<const_long,_ompi_datatype_t_*>_>_>
                *members)

{
  mapped_type *ppoVar1;
  tuple<int,_int,_int> tuple;
  MPI_Aint displ;
  MPI_Aint elem_adr;
  MPI_Aint t_adr;
  undefined8 local_44;
  undefined4 local_3c;
  long local_38;
  long local_30;
  long local_28;
  
  local_44 = 0;
  local_3c = 0;
  MPI_Get_address(&local_44,&local_28);
  MPI_Get_address((long)&local_44 + 4,&local_30);
  local_38 = local_30 - local_28;
  ppoVar1 = std::
            map<long,_ompi_datatype_t_*,_std::less<long>,_std::allocator<std::pair<const_long,_ompi_datatype_t_*>_>_>
            ::operator[](members,&local_38);
  *ppoVar1 = (mapped_type)&ompi_mpi_int;
  tuple_members<3UL,_1UL,_int,_int,_int>::get(members);
  return;
}

Assistant:

static size_t num_basic_elements() {
        return size*datatype_builder<T>::num_basic_elements();
    }